

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O3

void pltcalc::
     read_input<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,std::vector<period_occ,std::allocator<period_occ>>>
               (_func_void_outrec_ptr_int_FILE_ptr *OutputData,FILE *outFile,FILE **fout,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,vector<period_occ,_std::allocator<period_occ>_> *vp)

{
  sampleslevelRec sVar1;
  size_t sVar2;
  float fVar3;
  OASIS_FLOAT OVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  sampleslevelRec sr;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> vrec;
  summarySampleslevelHeader sh;
  int summary_set;
  sampleslevelRec local_b8;
  OASIS_FLOAT local_b0;
  OASIS_FLOAT local_ac;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> local_a8;
  summarySampleslevelHeader local_84;
  _func_void_outrec_ptr_int_FILE_ptr *local_78;
  FILE *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_4c;
  undefined1 local_48 [16];
  
  local_4c = 0;
  local_78 = OutputData;
  local_70 = outFile;
  sVar2 = fread(&local_4c,4,1,_stdin);
  local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_start = (sampleslevelRec *)0x0;
  local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_finish = (sampleslevelRec *)0x0;
  local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (sampleslevelRec *)0x0;
  if (sVar2 == 0) {
    return;
  }
LAB_00103778:
  sVar2 = fread(&local_84,0xc,1,_stdin);
  if (sVar2 != 0) {
    local_68 = 0;
    uStack_60 = 0;
    local_b0 = 0.0;
    local_ac = 0.0;
    do {
      sVar2 = fread(&local_b8,8,1,_stdin);
      if (local_b8.sidx != -4) {
        if ((sVar2 == 0) || (local_b8.sidx == 0)) goto LAB_001038f4;
        local_48 = ZEXT816(0);
        if (-2 < local_b8.sidx) {
          fVar3 = (float)(-(uint)(0.0 < local_b8.loss) & 0x3f800000) * local_84.expval;
          local_48 = ZEXT416((uint)fVar3);
          outputrows_splt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&local_84,&local_b8,fout[1],m_occ,vp,fVar3);
        }
        if (local_b8.sidx == -1) {
          domeanout<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&local_84,local_b8.loss,local_78,local_70,m_occ,vp,0.0,local_ac);
        }
        else if (local_b8.sidx == -5) {
          local_ac = local_b8.loss;
        }
        else {
          if (local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<sampleslevelRec,std::allocator<sampleslevelRec>>::
            _M_realloc_insert<sampleslevelRec_const&>
                      ((vector<sampleslevelRec,std::allocator<sampleslevelRec>> *)&local_a8,
                       (iterator)
                       local_a8.
                       super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl
                       .super__Vector_impl_data._M_finish,&local_b8);
          }
          else {
            sVar1.loss = local_b8.loss;
            sVar1.sidx = local_b8.sidx;
            *local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
             super__Vector_impl_data._M_finish = sVar1;
            local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          fVar3 = (float)samplesize_;
          OVar4 = (OASIS_FLOAT)local_48._0_4_;
          if ((float)local_48._0_4_ <= local_b0) {
            OVar4 = local_b0;
          }
          auVar5._0_8_ = CONCAT44(-(uint)(0.0 < local_b8.loss),local_48._0_4_) & 0x3f800000ffffffff;
          auVar5._8_4_ = local_48._4_4_;
          auVar5._12_4_ = 0;
          auVar6._4_4_ = fVar3;
          auVar6._0_4_ = fVar3;
          auVar6._8_4_ = fVar3;
          auVar6._12_4_ = fVar3;
          auVar6 = divps(auVar5,auVar6);
          local_68 = CONCAT44(local_68._4_4_ + auVar6._4_4_,(float)local_68 + auVar6._0_4_);
          uStack_60 = CONCAT44(uStack_60._4_4_ + auVar6._12_4_,(float)uStack_60 + auVar6._8_4_);
          local_b0 = OVar4;
        }
      }
      if (sVar2 == 0) break;
    } while( true );
  }
  goto LAB_0010395e;
LAB_001038f4:
  dopltcalc<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
            (&local_84,&local_a8,local_78,local_70,m_occ,vp,local_b0,(float)local_68,local_68._4_4_,
             local_ac);
  outputrows_qplt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
            (&local_84,&local_a8,fout[2],m_occ,vp);
  if (local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (sVar2 == 0) {
LAB_0010395e:
    if (local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
        super__Vector_impl_data._M_start == (sampleslevelRec *)0x0) {
      return;
    }
    operator_delete(local_a8.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    return;
  }
  goto LAB_00103778;
}

Assistant:

inline void read_input(void (*OutputData)(const T&, const int, FILE*),
			       FILE * outFile, FILE ** fout,
			       moccT &m_occ, periodT &vp)
	{
		int summary_set = 0;
		size_t i = fread(&summary_set, sizeof(summary_set), 1, stdin);
		std::vector<sampleslevelRec> vrec;
		summarySampleslevelHeader sh;
		while (i != 0) {
			OASIS_FLOAT max_impacted_exposure = 0;
			OASIS_FLOAT mean_impacted_exposure = 0;
			OASIS_FLOAT chance_of_loss = 0;
			OASIS_FLOAT max_loss = 0;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0) {
				OASIS_FLOAT impacted_exposure = 0;
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (sr.sidx == number_of_affected_risk_idx) continue;
				if (i == 0 || sr.sidx == 0) {
					dopltcalc(sh, vrec, OutputData, outFile,
						  m_occ, vp,
						  max_impacted_exposure,
						  mean_impacted_exposure,
						  chance_of_loss, max_loss);
					outputrows_qplt(sh, vrec, fout[QPLT],
							m_occ, vp);
					vrec.clear();
					break;
				} else if (sr.sidx >= -1) {
					impacted_exposure = sh.expval * (sr.loss > 0);
					outputrows_splt(sh, sr, fout[SPLT],
							m_occ, vp,
							impacted_exposure);
				}

				if (sr.sidx == max_loss_idx) {
					max_loss = sr.loss;
				} else if (sr.sidx == mean_idx) {
					domeanout(sh, sr.loss, OutputData,
						  outFile, m_occ, vp, 0.0,
						  max_loss);
				} else {
					vrec.push_back(sr);
					mean_impacted_exposure += impacted_exposure / samplesize_;
					if (impacted_exposure > max_impacted_exposure) {
						max_impacted_exposure = impacted_exposure;
					}
					chance_of_loss += (sr.loss > 0) / (OASIS_FLOAT)samplesize_;   // Relative frequency
				}
			}
		}
	}